

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::add_argument_buffer_padding_image_type
          (CompilerMSL *this,SPIRType *struct_type,uint32_t *mbr_idx,uint32_t *arg_buff_index,
          MSLResourceBinding *rez_bind)

{
  uint32_t id;
  SPIRType *pSVar1;
  
  if (this->argument_buffer_padding_image_type_id == 0) {
    id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,2);
    pSVar1 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,id);
    *(undefined8 *)&(pSVar1->super_IVariant).field_0xc = 0x200000000d;
    pSVar1 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,id + 1);
    *(undefined4 *)&(pSVar1->super_IVariant).field_0xc = 0x10;
    pSVar1->storage = StorageClassUniformConstant;
    (pSVar1->image).type.id = id;
    (pSVar1->image).dim = Dim2D;
    (pSVar1->image).depth = false;
    (pSVar1->image).arrayed = false;
    (pSVar1->image).ms = false;
    (pSVar1->image).sampled = 1;
    (pSVar1->image).format = ImageFormatUnknown;
    (pSVar1->image).access = AccessQualifierMax;
    this->argument_buffer_padding_image_type_id = id + 1;
  }
  add_argument_buffer_padding_type
            (this,this->argument_buffer_padding_image_type_id,struct_type,mbr_idx,arg_buff_index,
             rez_bind->count);
  return;
}

Assistant:

void CompilerMSL::add_argument_buffer_padding_image_type(SPIRType &struct_type, uint32_t &mbr_idx,
                                                         uint32_t &arg_buff_index, MSLResourceBinding &rez_bind)
{
	if (!argument_buffer_padding_image_type_id)
	{
		uint32_t base_type_id = ir.increase_bound_by(2);
		auto &base_type = set<SPIRType>(base_type_id);
		base_type.basetype = SPIRType::Float;
		base_type.width = 32;

		uint32_t img_type_id = base_type_id + 1;
		auto &img_type = set<SPIRType>(img_type_id);
		img_type.basetype = SPIRType::Image;
		img_type.storage = StorageClassUniformConstant;

		img_type.image.type = base_type_id;
		img_type.image.dim = Dim2D;
		img_type.image.depth = false;
		img_type.image.arrayed = false;
		img_type.image.ms = false;
		img_type.image.sampled = 1;
		img_type.image.format = ImageFormatUnknown;
		img_type.image.access = AccessQualifierMax;

		argument_buffer_padding_image_type_id = img_type_id;
	}

	add_argument_buffer_padding_type(argument_buffer_padding_image_type_id, struct_type, mbr_idx, arg_buff_index, rez_bind.count);
}